

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O2

void __thiscall
gl4cts::CopyOpsBufferStorageTestCase::deinitTestCaseIteration(CopyOpsBufferStorageTestCase *this)

{
  GLenum GVar1;
  uint n_sparse_bo;
  long lVar2;
  
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    if (this->m_sparse_bos[lVar2] != 0) {
      (*this->m_gl->bindBuffer)(0x8892,this->m_sparse_bos[lVar2]);
      GVar1 = (*this->m_gl->getError)();
      glu::checkError(GVar1,"glBindBuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x7a6);
      (*this->m_gl->bufferPageCommitmentARB)(0x8892,0,(ulong)this->m_sparse_bo_size_rounded,'\0');
      GVar1 = (*this->m_gl->getError)();
      glu::checkError(GVar1,"glBufferPageCommitmentARB() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x7aa);
    }
  }
  return;
}

Assistant:

void CopyOpsBufferStorageTestCase::deinitTestCaseIteration()
{
	for (unsigned int n_sparse_bo = 0; n_sparse_bo < sizeof(m_sparse_bos) / sizeof(m_sparse_bos[0]); ++n_sparse_bo)
	{
		const glw::GLuint sparse_bo_id = m_sparse_bos[n_sparse_bo];

		if (sparse_bo_id != 0)
		{
			m_gl.bindBuffer(GL_ARRAY_BUFFER, sparse_bo_id);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call failed.");

			m_gl.bufferPageCommitmentARB(GL_ARRAY_BUFFER, 0,				  /* offset */
										 m_sparse_bo_size_rounded, GL_FALSE); /* commit */
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");
		} /* if (sparse_bo_id != 0) */
	}	 /* for (both BOs) */
}